

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall gl4cts::BasicBufferState::Run(BasicBufferState *this)

{
  GLuint buffer_00;
  long lVar1;
  undefined1 local_78 [8];
  Buffer buffer;
  BasicBufferState *this_local;
  
  buffer.map_length_ = (GLint64)this;
  gl4cts::anon_unknown_0::Buffer::Buffer((Buffer *)local_78);
  buffer_00 = gl4cts::anon_unknown_0::Buffer::name((Buffer *)local_78);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,buffer_00);
  lVar1 = gl4cts::anon_unknown_0::Buffer::Verify((Buffer *)local_78);
  if (lVar1 == 0) {
    gl4cts::anon_unknown_0::Buffer::Data((Buffer *)local_78,100,(void *)0x0,0x88ea);
    lVar1 = gl4cts::anon_unknown_0::Buffer::Verify((Buffer *)local_78);
    if (lVar1 == 0) {
      gl4cts::anon_unknown_0::Buffer::MapRange((Buffer *)local_78,10,0x32,2);
      lVar1 = gl4cts::anon_unknown_0::Buffer::Verify((Buffer *)local_78);
      if (lVar1 == 0) {
        gl4cts::anon_unknown_0::Buffer::Unmap((Buffer *)local_78);
        lVar1 = gl4cts::anon_unknown_0::Buffer::Verify((Buffer *)local_78);
        if (lVar1 == 0) {
          gl4cts::anon_unknown_0::Buffer::Map((Buffer *)local_78,35000);
          lVar1 = gl4cts::anon_unknown_0::Buffer::Verify((Buffer *)local_78);
          if (lVar1 == 0) {
            gl4cts::anon_unknown_0::Buffer::Unmap((Buffer *)local_78);
            lVar1 = gl4cts::anon_unknown_0::Buffer::Verify((Buffer *)local_78);
            if (lVar1 == 0) {
              this_local = (BasicBufferState *)0x0;
            }
            else {
              this_local = (BasicBufferState *)&DAT_ffffffffffffffff;
            }
          }
          else {
            this_local = (BasicBufferState *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (BasicBufferState *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (BasicBufferState *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (BasicBufferState *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (BasicBufferState *)&DAT_ffffffffffffffff;
  }
  gl4cts::anon_unknown_0::Buffer::~Buffer((Buffer *)local_78);
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		Buffer buffer;
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer.name());

		if (buffer.Verify() != NO_ERROR)
			return ERROR;

		buffer.Data(100, NULL, GL_DYNAMIC_COPY);
		if (buffer.Verify() != NO_ERROR)
			return ERROR;

		buffer.MapRange(10, 50, GL_MAP_WRITE_BIT);
		if (buffer.Verify() != NO_ERROR)
			return ERROR;
		buffer.Unmap();
		if (buffer.Verify() != NO_ERROR)
			return ERROR;

		buffer.Map(GL_READ_ONLY);
		if (buffer.Verify() != NO_ERROR)
			return ERROR;
		buffer.Unmap();
		if (buffer.Verify() != NO_ERROR)
			return ERROR;

		return NO_ERROR;
	}